

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O0

void unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
               (rt_binary_expr<viennamath::rt_expression_interface<double>_> *e)

{
  reference pvVar1;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_00;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_01;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_02;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_03;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_04;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_05;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_06;
  numeric_type nVar2;
  double dVar3;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_200;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_1e0;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_1c8;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_1a8;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_190;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_170;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_158;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_138;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_120;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_100;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_e8;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_c8;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_b0;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_90;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_78;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_58;
  allocator<double> local_29;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> p;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *e_local;
  
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)e;
  std::allocator<double>::allocator(&local_29);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,3,&local_29);
  std::allocator<double>::~allocator(&local_29);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,0);
  *pvVar1 = 4.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,1);
  *pvVar1 = 6.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,2);
  *pvVar1 = 8.0;
  viennamath::exp<viennamath::rt_expression_interface<double>>
            (&local_58,
             (viennamath *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,other);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_78,
             (binary_expr *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_78,(vector<double,_std::allocator<double>_> *)local_28);
  dVar3 = exp(nVar2);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_58,dVar3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_78);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr(&local_58)
  ;
  viennamath::sin<viennamath::rt_expression_interface<double>>
            (&local_90,
             (viennamath *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,other_00);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_b0,
             (binary_expr *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_b0,(vector<double,_std::allocator<double>_> *)local_28);
  dVar3 = sin(nVar2);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_90,dVar3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_b0);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr(&local_90)
  ;
  viennamath::cos<viennamath::rt_expression_interface<double>>
            (&local_c8,
             (viennamath *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,other_01);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_e8,
             (binary_expr *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_e8,(vector<double,_std::allocator<double>_> *)local_28);
  dVar3 = cos(nVar2);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_c8,dVar3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_e8);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr(&local_c8)
  ;
  viennamath::tan<viennamath::rt_expression_interface<double>>
            (&local_100,
             (viennamath *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,other_02);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_120,
             (binary_expr *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_120,(vector<double,_std::allocator<double>_> *)local_28);
  dVar3 = tan(nVar2);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_100,dVar3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_120);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_100);
  viennamath::fabs<viennamath::rt_expression_interface<double>>
            (&local_138,
             (viennamath *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,other_03);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_158,
             (binary_expr *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_158,(vector<double,_std::allocator<double>_> *)local_28);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_138,ABS(nVar2));
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_158);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_138);
  viennamath::sqrt<viennamath::rt_expression_interface<double>>
            (&local_170,
             (viennamath *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,other_04);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_190,
             (binary_expr *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_190,(vector<double,_std::allocator<double>_> *)local_28);
  dVar3 = sqrt(nVar2);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_170,dVar3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_190);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_170);
  viennamath::log<viennamath::rt_expression_interface<double>>
            (&local_1a8,
             (viennamath *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,other_05);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_1c8,
             (binary_expr *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_1c8,(vector<double,_std::allocator<double>_> *)local_28);
  dVar3 = log(nVar2);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_1a8,dVar3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_1c8);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_1a8);
  viennamath::log10<viennamath::rt_expression_interface<double>>
            (&local_1e0,
             (viennamath *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,other_06);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (&local_200,
             (binary_expr *)
             p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  nVar2 = viennamath::
          eval<viennamath::rt_expression_interface<double>,std::vector<double,std::allocator<double>>>
                    (&local_200,(vector<double,_std::allocator<double>_> *)local_28);
  dVar3 = log10(nVar2);
  unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
            (&local_1e0,dVar3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_200);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_1e0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return;
}

Assistant:

void unary_test(E const & e)
{
  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  unary_test(viennamath::exp(e),   exp(viennamath::eval(e,p)) );
  unary_test(viennamath::sin(e),   sin(viennamath::eval(e,p)) );
  unary_test(viennamath::cos(e),   cos(viennamath::eval(e,p)) );
  unary_test(viennamath::tan(e),   tan(viennamath::eval(e,p)) );
  unary_test(viennamath::fabs(e),  fabs(viennamath::eval(e,p)) );
  unary_test(viennamath::sqrt(e),  sqrt(viennamath::eval(e,p)) );
  unary_test(viennamath::log(e),   log(viennamath::eval(e,p)) );
  unary_test(viennamath::log10(e), log10(viennamath::eval(e,p)) );
}